

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O1

int enet_socket_get_address(ENetSocket socket,ENetAddress *address)

{
  int iVar1;
  socklen_t sinLength;
  sockaddr_in sin;
  socklen_t local_1c;
  sockaddr local_18;
  
  local_1c = 0x10;
  iVar1 = getsockname(socket,&local_18,&local_1c);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    address->host = local_18.sa_data._2_4_;
    address->port = local_18.sa_data._0_2_ << 8 | (ushort)local_18.sa_data._0_2_ >> 8;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
enet_socket_get_address (ENetSocket socket, ENetAddress * address)
{
    struct sockaddr_in sin;
    socklen_t sinLength = sizeof (struct sockaddr_in);

    if (getsockname (socket, (struct sockaddr *) & sin, & sinLength) == -1)
      return -1;

    address -> host = (enet_uint32) sin.sin_addr.s_addr;
    address -> port = ENET_NET_TO_HOST_16 (sin.sin_port);

    return 0;
}